

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<ProjectBuilderSources>::emplace<ProjectBuilderSources>
          (QGenericArrayOps<ProjectBuilderSources> *this,qsizetype i,ProjectBuilderSources *args)

{
  undefined1 uVar1;
  uint uVar2;
  qsizetype qVar3;
  Inserter *in_RDX;
  char16_t *in_RSI;
  ProjectBuilderSources *in_RDI;
  long in_FS_OFFSET;
  bool bVar4;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  ProjectBuilderSources tmp;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  undefined1 uVar5;
  undefined4 in_stack_ffffffffffffff38;
  undefined2 in_stack_ffffffffffffff3c;
  undefined1 in_stack_ffffffffffffff3e;
  byte bVar6;
  ProjectBuilderSources *this_00;
  Inserter local_a8;
  undefined1 local_58 [80];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  uVar1 = QArrayDataPointer<ProjectBuilderSources>::needsDetach
                    ((QArrayDataPointer<ProjectBuilderSources> *)in_RDI);
  if (!(bool)uVar1) {
    if ((in_RSI == (in_RDI->key).d.ptr) &&
       (qVar3 = QArrayDataPointer<ProjectBuilderSources>::freeSpaceAtEnd
                          ((QArrayDataPointer<ProjectBuilderSources> *)
                           CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff3e,
                                                   CONCAT24(in_stack_ffffffffffffff3c,
                                                            in_stack_ffffffffffffff38)))),
       qVar3 != 0)) {
      QArrayDataPointer<ProjectBuilderSources>::end
                ((QArrayDataPointer<ProjectBuilderSources> *)in_RDI);
      ProjectBuilderSources::ProjectBuilderSources
                (in_RDI,(ProjectBuilderSources *)
                        CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
      (in_RDI->key).d.ptr = (char16_t *)((long)(in_RDI->key).d.ptr + 1);
      goto LAB_00160f12;
    }
    if ((in_RSI == (char16_t *)0x0) &&
       (qVar3 = QArrayDataPointer<ProjectBuilderSources>::freeSpaceAtBegin
                          ((QArrayDataPointer<ProjectBuilderSources> *)
                           CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff3e,
                                                   CONCAT24(in_stack_ffffffffffffff3c,
                                                            in_stack_ffffffffffffff38)))),
       qVar3 != 0)) {
      QArrayDataPointer<ProjectBuilderSources>::begin
                ((QArrayDataPointer<ProjectBuilderSources> *)0x160dda);
      ProjectBuilderSources::ProjectBuilderSources
                (in_RDI,(ProjectBuilderSources *)
                        CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
      (in_RDI->key).d.d = (in_RDI->key).d.d + -5;
      (in_RDI->key).d.ptr = (char16_t *)((long)(in_RDI->key).d.ptr + 1);
      goto LAB_00160f12;
    }
  }
  memset(local_58,0xaa,0x50);
  ProjectBuilderSources::ProjectBuilderSources
            (in_RDI,(ProjectBuilderSources *)
                    CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
  bVar4 = (in_RDI->key).d.ptr != (char16_t *)0x0;
  uVar5 = bVar4 && in_RSI == (char16_t *)0x0;
  uVar2 = (uint)(bVar4 && in_RSI == (char16_t *)0x0);
  bVar6 = uVar5;
  QArrayDataPointer<ProjectBuilderSources>::detachAndGrow
            ((QArrayDataPointer<ProjectBuilderSources> *)this_00,
             (GrowthPosition)((ulong)in_RSI >> 0x20),(qsizetype)in_RDX,
             (ProjectBuilderSources **)
             CONCAT17(uVar1,CONCAT16(uVar5,CONCAT24(in_stack_ffffffffffffff3c,uVar2))),
             (QArrayDataPointer<ProjectBuilderSources> *)in_RDI);
  if ((bVar6 & 1) == 0) {
    Inserter::Inserter(&local_a8,(QArrayDataPointer<ProjectBuilderSources> *)in_RDI);
    Inserter::insertOne(in_RDX,CONCAT17(uVar1,CONCAT16(bVar6,CONCAT24(in_stack_ffffffffffffff3c,
                                                                      uVar2))),in_RDI);
    Inserter::~Inserter(&local_a8);
  }
  else {
    QArrayDataPointer<ProjectBuilderSources>::begin
              ((QArrayDataPointer<ProjectBuilderSources> *)0x160ea2);
    ProjectBuilderSources::ProjectBuilderSources
              (in_RDI,(ProjectBuilderSources *)CONCAT17(uVar5,in_stack_ffffffffffffff28));
    (in_RDI->key).d.d = (in_RDI->key).d.d + -5;
    (in_RDI->key).d.ptr = (char16_t *)((long)(in_RDI->key).d.ptr + 1);
  }
  ProjectBuilderSources::~ProjectBuilderSources(in_RDI);
LAB_00160f12:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this).insertOne(i, std::move(tmp));
        }
    }